

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_standard_env_op(sexp ctx,sexp self,sexp_sint_t n,sexp version)

{
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp env;
  sexp in_stack_00000038;
  sexp in_stack_00000040;
  sexp in_stack_00000100;
  sexp in_stack_00000108;
  sexp in_stack_00000110;
  sexp *local_38;
  undefined8 local_30;
  sexp local_28 [4];
  long local_8;
  
  local_28[0] = (sexp)0x43e;
  local_8 = in_RDI;
  memset(&local_38,0,0x10);
  local_38 = local_28;
  local_30 = *(undefined8 *)(local_8 + 0x6080);
  *(sexp ***)(local_8 + 0x6080) = &local_38;
  local_28[0] = sexp_make_primitive_env_op
                          (in_stack_00000040,in_stack_00000038,(sexp_sint_t)ctx,self);
  if ((((ulong)local_28[0] & 3) != 0) || (local_28[0]->tag != 0x13)) {
    local_28[0] = sexp_load_standard_env(in_stack_00000110,in_stack_00000108,in_stack_00000100);
  }
  if ((((ulong)local_28[0] & 3) == 0) && (local_28[0]->tag == 0x17)) {
    local_28[0]->field_0x5 = local_28[0]->field_0x5 & 0xfe | 1;
  }
  *(undefined8 *)(local_8 + 0x6080) = local_30;
  return local_28[0];
}

Assistant:

sexp sexp_make_standard_env_op (sexp ctx, sexp self, sexp_sint_t n, sexp version) {
  sexp_gc_var1(env);
  sexp_gc_preserve1(ctx, env);
  env = sexp_make_primitive_env(ctx, version);
  if (! sexp_exceptionp(env)) env = sexp_load_standard_env(ctx, env, SEXP_SEVEN);
  if (sexp_envp(env)) sexp_immutablep(env) = 1;
  sexp_gc_release1(ctx);
  return env;
}